

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O1

void __thiscall V2LFO::tick(V2LFO *this)

{
  uint32_t *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  
  uVar2 = this->cntr;
  uVar4 = this->mode & 7;
  uVar3 = uVar2;
  if (uVar4 - 1 < 4) {
    uVar3 = (int)uVar2 >> 0x1f;
    switch(uVar4) {
    case 1:
      uVar3 = uVar3 ^ uVar2 * 2;
      break;
    case 2:
      break;
    case 3:
      fVar5 = fastsinrc(((float)(uVar2 >> 9 | 0x3f800000) + -1.0) * 6.2831855);
      fVar5 = fVar5 * 0.5 + 0.5;
      goto LAB_0010974b;
    case 4:
      if (uVar2 < this->last) {
        this->nseed = this->nseed * 0xbb38435 + 0x3619636b;
      }
      this->last = uVar2;
      uVar3 = this->nseed;
    }
  }
  fVar5 = (float)(uVar3 >> 9 | 0x3f800000) + -1.0;
LAB_0010974b:
  this->out = fVar5 * this->gain + this->dc;
  puVar1 = &this->cntr;
  uVar2 = *puVar1;
  *puVar1 = *puVar1 + this->freq;
  if ((CARRY4(uVar2,this->freq)) && (this->eg == true)) {
    this->cntr = 0xffffffff;
  }
  return;
}

Assistant:

void tick()
    {
        float v;
        uint32_t x;

        switch (mode & 7)
        {
        case SAW:
        default:
            COVER("LFO saw");
            v = utof23(cntr);
            break;

        case TRI:
            COVER("LFO tri");
            x = (cntr << 1) ^ (int32_t(cntr) >> 31);
            v = utof23(x);
            break;

        case PULSE:
            COVER("LFO pulse");
            x = int32_t(cntr) >> 31;
            v = utof23(x);
            break;

        case SIN:
            COVER("LFO sin");
            v = utof23(cntr);
            v = fastsinrc(v * fc2pi) * 0.5f + 0.5f;
            break;

        case S_H:
            COVER("LFO sample+hold");
            if (cntr < last)
                nseed = urandom(&nseed);
            last = cntr;
            v = utof23(nseed);
            break;
        }

        out = v * gain + dc;
        cntr += freq;
        if (cntr < (uint32_t)freq && eg) // in one-shot mode, clamp at wrap-around
            cntr = ~0u;

        DEBUG_PLOT_VAL(this, out / 128.0f);
    }